

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ArrayIndex AVar2;
  ArrayIndex i;
  ArrayIndex AVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  pVar4;
  OStringStream oss;
  String SStack_1c8;
  ValueHolder local_1a8;
  ArrayIndex local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  
  if (*(char *)&this->bits_ == '\0') {
    local_1a0 = CONCAT22(local_1a0._2_2_,6);
    local_198 = 0;
    uStack_190 = 0;
    local_188 = 0;
    local_1a8.string_ = (char *)operator_new(0x30);
    p_Var1 = &((local_1a8.map_)->_M_t)._M_impl.super__Rb_tree_header;
    ((local_1a8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ((local_1a8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(char *)((long)local_1a8 + 0) = '\0';
    *(char *)((long)local_1a8 + 1) = '\0';
    *(char *)((long)local_1a8 + 2) = '\0';
    *(char *)((long)local_1a8 + 3) = '\0';
    *(char *)((long)local_1a8 + 4) = '\0';
    *(char *)((long)local_1a8 + 5) = '\0';
    *(char *)((long)local_1a8 + 6) = '\0';
    *(char *)((long)local_1a8 + 7) = '\0';
    *(undefined8 *)&((local_1a8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    ((local_1a8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    ((local_1a8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    ((local_1a8.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    swap((Value *)&local_1a8,this);
    ~Value((Value *)&local_1a8);
  }
  else if (*(char *)&this->bits_ != '\x06') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.bool_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"in Json::Value::resize(): requires arrayValue",0x2d);
    std::__cxx11::stringbuf::str();
    throwLogicError(&SStack_1c8);
  }
  AVar2 = size(this);
  if (newSize == 0) {
    clear(this);
  }
  else if (AVar2 < newSize) {
    do {
      operator[](this,AVar2);
      AVar2 = AVar2 + 1;
    } while (newSize != AVar2);
  }
  else {
    if (newSize < AVar2) {
      AVar3 = newSize;
      do {
        this_00 = &((this->value_).map_)->_M_t;
        local_1a8.int_ = 0;
        local_1a0 = AVar3;
        pVar4 = std::
                _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                ::equal_range(this_00,(key_type *)&local_1a8);
        std::
        _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::_M_erase_aux(this_00,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
        if ((local_1a8 != (undefined8 *)0x0) && ((local_1a0 & 3) == 1)) {
          free(local_1a8.string_);
        }
        AVar3 = AVar3 + 1;
      } while (AVar2 != AVar3);
    }
    AVar2 = size(this);
    if (AVar2 != newSize) {
      local_1a8.string_ = (char *)&local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"assert json failed","");
      throwLogicError((String *)&local_1a8);
    }
  }
  return;
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type() == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    for (ArrayIndex i = oldSize; i < newSize; ++i)
      (*this)[i];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    JSON_ASSERT(size() == newSize);
  }
}